

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TypeSpecializeNumberUnary(GlobOpt *this,Instr *instr,Value *src1Val,Value **pDstVal)

{
  code *pcVar1;
  bool bVar2;
  ValueInfo *pVVar3;
  undefined4 *puVar4;
  Value **pDstVal_local;
  Value *src1Val_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  pVVar3 = ::Value::GetValueInfo(src1Val);
  bVar2 = ValueType::IsNumber(&pVVar3->super_ValueType);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1da1,"(src1Val->GetValueInfo()->IsNumber())",
                       "src1Val->GetValueInfo()->IsNumber()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IsLoopPrePass(this);
  if ((!bVar2) && (instr->m_opcode == Conv_Num)) {
    instr->m_opcode = Ld_A;
  }
  return false;
}

Assistant:

bool
GlobOpt::TypeSpecializeNumberUnary(IR::Instr *instr, Value *src1Val, Value **pDstVal)
{
    Assert(src1Val->GetValueInfo()->IsNumber());

    if (this->IsLoopPrePass())
    {
        return false;
    }

    switch (instr->m_opcode)
    {
    case Js::OpCode::Conv_Num:
        // Optimize Conv_Num away since we know this is a number
        instr->m_opcode = Js::OpCode::Ld_A;
        return false;
    }

    return false;
}